

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise3d.cpp
# Opt level: O2

void __thiscall
ncnn::DeconvolutionDepthWise3D::cut_padding
          (DeconvolutionDepthWise3D *this,Mat *top_blob_bordered,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  iVar3 = this->pad_left;
  iVar10 = this->pad_right;
  if ((((iVar10 < 1 && iVar3 < 1) && (iVar2 = this->pad_top, iVar2 < 1)) &&
      (iVar6 = this->pad_bottom, iVar6 < 1)) &&
     ((iVar4 = this->pad_front, iVar4 < 1 && (iVar9 = this->pad_behind, iVar9 < 1)))) {
    if (((this->output_w < 1) || (this->output_h < 1)) || (this->output_d < 1)) {
      if (top_blob == top_blob_bordered) {
        return;
      }
      piVar1 = top_blob_bordered->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar1 = top_blob_bordered->refcount;
      top_blob->data = top_blob_bordered->data;
      top_blob->refcount = piVar1;
      top_blob->elemsize = top_blob_bordered->elemsize;
      top_blob->elempack = top_blob_bordered->elempack;
      top_blob->allocator = top_blob_bordered->allocator;
      iVar3 = top_blob_bordered->w;
      iVar10 = top_blob_bordered->h;
      iVar2 = top_blob_bordered->d;
      top_blob->dims = top_blob_bordered->dims;
      top_blob->w = iVar3;
      top_blob->h = iVar10;
      top_blob->d = iVar2;
      top_blob->c = top_blob_bordered->c;
      top_blob->cstep = top_blob_bordered->cstep;
      return;
    }
    iVar7 = top_blob_bordered->w - this->output_w;
    iVar5 = top_blob_bordered->h - this->output_h;
    iVar8 = top_blob_bordered->d - this->output_d;
    if ((iVar4 == -0xe9 ||
        ((iVar6 == -0xe9 || iVar2 == -0xe9) || (iVar10 == -0xe9 || iVar3 == -0xe9))) ||
        iVar9 == -0xe9) {
      iVar2 = iVar5 / 2;
      iVar6 = iVar5 - iVar2;
      iVar3 = iVar7 / 2;
      iVar10 = iVar7 - iVar3;
      iVar4 = iVar8 / 2;
      iVar9 = iVar8 - iVar4;
    }
    else {
      if ((iVar4 != -0xea &&
          ((iVar6 != -0xea && iVar2 != -0xea) && (iVar10 != -0xea && iVar3 != -0xea))) &&
          iVar9 != -0xea) {
        return;
      }
      iVar6 = iVar5 / 2;
      iVar2 = iVar5 - iVar6;
      iVar10 = iVar7 / 2;
      iVar3 = iVar7 - iVar10;
      iVar9 = iVar8 / 2;
      iVar4 = iVar8 - iVar9;
    }
  }
  else {
    iVar2 = this->pad_top;
    iVar6 = this->pad_bottom;
    iVar4 = this->pad_front;
    iVar9 = this->pad_behind;
  }
  copy_cut_border_3d(top_blob_bordered,top_blob,iVar2,iVar6,iVar3,iVar10,iVar4,iVar9,opt);
  return;
}

Assistant:

void DeconvolutionDepthWise3D::cut_padding(const Mat& top_blob_bordered, Mat& top_blob, const Option& opt) const
{
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0)
    {
        copy_cut_border_3d(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, pad_front, pad_behind, opt);
    }
    else if (output_w > 0 && output_h > 0 && output_d > 0)
    {
        int wcut = top_blob_bordered.w - output_w;
        int hcut = top_blob_bordered.h - output_h;
        int dcut = top_blob_bordered.d - output_d;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233 || pad_front == -233 || pad_behind == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border_3d(top_blob_bordered, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, dcut / 2, dcut - dcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234 || pad_front == -234 || pad_behind == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border_3d(top_blob_bordered, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, dcut - dcut / 2, dcut / 2, opt);
        }
    }
    else
    {
        top_blob = top_blob_bordered;
    }
}